

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasthessian_opt.h
# Opt level: O1

void image_32_filter_99_case(response_layer *layer,integral_image *iimage)

{
  float fVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  float *pfVar5;
  float *pfVar6;
  bool *pbVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined1 auVar11 [16];
  uint uVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  float *pfVar16;
  float *pfVar17;
  float *pfVar18;
  float *pfVar19;
  int iVar20;
  float *pfVar21;
  float *pfVar22;
  long lVar23;
  int iVar24;
  float *pfVar25;
  long lVar26;
  float *pfVar27;
  long lVar28;
  float *pfVar29;
  long lVar30;
  bool *pbVar31;
  uint uVar32;
  ulong uVar33;
  long lVar34;
  long lVar35;
  float *pfVar36;
  long lVar37;
  uint uVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  float fVar42;
  float *local_130;
  float *local_128;
  float *local_100;
  float *local_e0;
  float *local_d8;
  float *local_c8;
  float *local_c0;
  float *data;
  int local_40;
  
  iVar2 = layer->height;
  iVar3 = iimage->data_width;
  lVar34 = (long)iVar3;
  pfVar5 = iimage->data;
  iVar4 = layer->step;
  lVar23 = (long)iVar4;
  iVar20 = layer->filter_size;
  uVar14 = (iVar20 + -1) - (iVar20 + -1 >> 0x1f) >> 1;
  uVar12 = iVar20 / 3;
  fVar42 = 1.0 / (float)(iVar20 * iVar20);
  pfVar6 = layer->response;
  pbVar7 = layer->laplacian;
  local_40 = iimage->width + -1;
  fVar1 = pfVar5[((long)iimage->height + -1) * lVar34 + -1 + (long)iimage->width];
  lVar30 = layer->width * lVar23;
  uVar13 = iVar20 / 6;
  iVar20 = (int)lVar30;
  uVar33 = (ulong)(int)uVar12;
  lVar28 = (long)(int)uVar13;
  if (iVar20 - uVar13 == 0 || iVar20 < (int)uVar13) {
    iVar24 = 0;
    lVar15 = 0;
  }
  else {
    lVar15 = lVar34 * uVar33;
    pfVar29 = pfVar5 + lVar15;
    pfVar17 = pfVar5 + -lVar34;
    lVar26 = (uVar33 - 1) * lVar34;
    lVar37 = lVar23 * lVar34;
    pfVar22 = pfVar5 + ~uVar33 * lVar34;
    pfVar19 = pfVar5 + ((lVar26 + -1) - lVar28);
    lVar35 = (lVar28 * 4 + lVar15 * 4 ^ 0xfffffffffffffffcU) + (long)pfVar5;
    pfVar18 = pfVar5 + lVar26 + (int)uVar14;
    pfVar27 = pfVar5 + ((int)uVar14 - lVar15);
    local_130 = (float *)((lVar34 * 4 + 4) * uVar33 + (long)pfVar5);
    pfVar25 = pfVar5 + (uVar33 - lVar34);
    local_d8 = pfVar5 + ((lVar26 + (uVar33 - 1)) - lVar28);
    pfVar21 = pfVar5 + ~uVar33 * lVar34 + uVar33;
    local_e0 = (float *)((lVar34 * -4 + 4) * uVar33 + lVar28 * -4 + -4 + (long)pfVar5);
    local_128 = pfVar5 + uVar33;
    lVar15 = 0;
    iVar24 = 0;
    pfVar16 = pfVar5;
    do {
      auVar11 = vfmadd213ss_fma(ZEXT416((uint)pfVar5[(int)((~uVar13 + uVar12 + (int)lVar15) * iVar3
                                                          + local_40)]),
                                SUB6416(ZEXT464(0xc0400000),0),ZEXT416((uint)fVar1));
      if (0 < iVar20) {
        fVar8 = fVar42 * auVar11._0_4_;
        pfVar36 = pfVar6 + iVar24;
        pbVar31 = pbVar7 + iVar24;
        lVar26 = 0;
        uVar38 = ~uVar14;
        uVar32 = ~uVar12;
        do {
          auVar11 = vfmadd132ss_fma(ZEXT416((uint)((local_d8[lVar26] -
                                                   *(float *)((long)local_e0 + lVar26 * 4)) +
                                                  (*(float *)(lVar35 + lVar26 * 4) - pfVar19[lVar26]
                                                  ))),
                                    ZEXT416((uint)((pfVar5[(lVar15 - uVar33) * lVar34 +
                                                           (long)(int)uVar38] -
                                                   pfVar5[(lVar15 + -1 + uVar33) * lVar34 +
                                                          (long)(int)uVar38]) +
                                                  (pfVar18[lVar26] - pfVar27[lVar26]))),
                                    SUB6416(ZEXT464(0xc0400000),0));
          fVar9 = fVar42 * auVar11._0_4_;
          fVar10 = fVar42 * ((((pfVar5[lVar15 * lVar34 + (long)(int)uVar32] -
                               pfVar5[(lVar15 + uVar33) * lVar34 + (long)(int)uVar32]) +
                               (pfVar29[lVar26 + -1] - pfVar16[lVar26 + -1]) +
                              (pfVar25[lVar26] - pfVar21[lVar26]) +
                              (pfVar22[lVar26] - pfVar17[lVar26])) -
                             ((pfVar5[((lVar15 + -1) - uVar33) * lVar34 + (long)(int)uVar32] -
                              pfVar5[(lVar15 + -1) * lVar34 + (long)(int)uVar32]) +
                             (pfVar17[lVar26 + -1] - pfVar22[lVar26 + -1]))) -
                            ((pfVar16[lVar26] - pfVar29[lVar26]) +
                            (local_130[lVar26] - local_128[lVar26])));
          auVar11 = vfmadd231ss_fma(ZEXT416((uint)(fVar10 * -0.81 * fVar10)),ZEXT416((uint)fVar9),
                                    ZEXT416((uint)fVar8));
          *pfVar36 = auVar11._0_4_;
          *pbVar31 = 0.0 <= fVar8 + fVar9;
          lVar26 = lVar26 + lVar23;
          pfVar36 = pfVar36 + 1;
          pbVar31 = pbVar31 + 1;
          iVar24 = iVar24 + 1;
          uVar32 = uVar32 + iVar4;
          uVar38 = uVar38 + iVar4;
        } while (lVar26 < lVar30);
      }
      lVar15 = lVar15 + lVar23;
      pfVar29 = pfVar29 + lVar37;
      pfVar16 = pfVar16 + lVar37;
      pfVar17 = pfVar17 + lVar37;
      pfVar22 = pfVar22 + lVar37;
      pfVar19 = pfVar19 + lVar37;
      lVar35 = lVar35 + lVar37 * 4;
      pfVar18 = pfVar18 + lVar37;
      pfVar27 = pfVar27 + lVar37;
      local_130 = local_130 + lVar37;
      local_128 = local_128 + lVar37;
      pfVar25 = pfVar25 + lVar37;
      pfVar21 = pfVar21 + lVar37;
      local_d8 = local_d8 + lVar37;
      local_e0 = (float *)((long)local_e0 + lVar37 * 4);
    } while (lVar15 < (long)(ulong)(iVar20 - uVar13));
  }
  fVar1 = fVar1 * -2.0;
  if ((int)lVar15 <= (int)uVar13) {
    fVar8 = fVar42 * fVar1;
    lVar15 = (long)(int)lVar15;
    lVar37 = (lVar15 + uVar33) * lVar34;
    pfVar29 = pfVar5 + lVar37;
    lVar30 = lVar23 * lVar34;
    lVar39 = (lVar15 + -1 + uVar33) * lVar34;
    lVar26 = (lVar15 - uVar33) * lVar34;
    lVar40 = (lVar15 + -1) * lVar34;
    lVar35 = ((lVar15 + -1) - uVar33) * lVar34;
    local_100 = pfVar5 + lVar15 * lVar34;
    local_c8 = pfVar5 + lVar40;
    pfVar22 = pfVar5 + lVar35;
    pfVar19 = pfVar5 + ((lVar39 + -1) - lVar28);
    local_128 = pfVar5 + ((lVar26 + -1) - lVar28);
    pfVar16 = pfVar5 + lVar39 + (int)uVar14;
    pfVar17 = pfVar5 + lVar26 + (int)uVar14;
    pfVar25 = pfVar5 + lVar37 + uVar33;
    pfVar21 = pfVar5 + lVar15 * lVar34 + uVar33;
    pfVar18 = pfVar5 + lVar40 + uVar33;
    local_e0 = pfVar5 + ((lVar39 + (uVar33 - 1)) - lVar28);
    pfVar27 = pfVar5 + lVar35 + uVar33;
    local_c0 = pfVar5 + ((lVar26 + (uVar33 - 1)) - lVar28);
    do {
      if (0 < iVar20) {
        pfVar36 = pfVar6 + iVar24;
        pbVar31 = pbVar7 + iVar24;
        lVar35 = 0;
        uVar38 = ~uVar14;
        uVar32 = ~uVar12;
        do {
          auVar11 = vfmadd132ss_fma(ZEXT416((uint)((local_e0[lVar35] - local_c0[lVar35]) +
                                                  (local_128[lVar35] - pfVar19[lVar35]))),
                                    ZEXT416((uint)((pfVar5[(lVar15 - uVar33) * lVar34 +
                                                           (long)(int)uVar38] -
                                                   pfVar5[(lVar15 + -1 + uVar33) * lVar34 +
                                                          (long)(int)uVar38]) +
                                                  (pfVar16[lVar35] - pfVar17[lVar35]))),
                                    SUB6416(ZEXT464(0xc0400000),0));
          fVar9 = fVar42 * auVar11._0_4_;
          fVar10 = fVar42 * ((((pfVar5[lVar15 * lVar34 + (long)(int)uVar32] -
                               pfVar5[(lVar15 + uVar33) * lVar34 + (long)(int)uVar32]) +
                               (pfVar29[lVar35 + -1] - local_100[lVar35 + -1]) +
                              (pfVar18[lVar35] - pfVar27[lVar35]) +
                              (pfVar22[lVar35] - local_c8[lVar35])) -
                             ((pfVar5[((lVar15 + -1) - uVar33) * lVar34 + (long)(int)uVar32] -
                              pfVar5[(lVar15 + -1) * lVar34 + (long)(int)uVar32]) +
                             (local_c8[lVar35 + -1] - pfVar22[lVar35 + -1]))) -
                            ((local_100[lVar35] - pfVar29[lVar35]) +
                            (pfVar25[lVar35] - pfVar21[lVar35])));
          auVar11 = vfmadd231ss_fma(ZEXT416((uint)(fVar10 * -0.81 * fVar10)),ZEXT416((uint)fVar9),
                                    ZEXT416((uint)fVar8));
          *pfVar36 = auVar11._0_4_;
          *pbVar31 = 0.0 <= fVar8 + fVar9;
          lVar35 = lVar35 + lVar23;
          pfVar36 = pfVar36 + 1;
          pbVar31 = pbVar31 + 1;
          iVar24 = iVar24 + 1;
          uVar32 = uVar32 + iVar4;
          uVar38 = uVar38 + iVar4;
        } while (lVar35 < iVar20);
      }
      lVar15 = lVar15 + lVar23;
      pfVar29 = pfVar29 + lVar30;
      local_100 = local_100 + lVar30;
      local_c8 = local_c8 + lVar30;
      pfVar22 = pfVar22 + lVar30;
      pfVar19 = pfVar19 + lVar30;
      local_128 = local_128 + lVar30;
      pfVar16 = pfVar16 + lVar30;
      pfVar17 = pfVar17 + lVar30;
      pfVar25 = pfVar25 + lVar30;
      pfVar21 = pfVar21 + lVar30;
      pfVar18 = pfVar18 + lVar30;
      pfVar27 = pfVar27 + lVar30;
      local_e0 = local_e0 + lVar30;
      local_c0 = local_c0 + lVar30;
    } while (lVar15 <= lVar28);
  }
  lVar30 = iVar2 * lVar23;
  if ((int)lVar15 < (int)lVar30) {
    lVar40 = (long)(int)lVar15;
    lVar15 = (lVar40 + uVar33) * lVar34;
    lVar35 = lVar23 * lVar34;
    lVar26 = (lVar40 + -1 + uVar33) * lVar34;
    lVar39 = (lVar40 - uVar33) * lVar34;
    lVar41 = (lVar40 + -1) * lVar34;
    lVar37 = ((lVar40 + -1) - uVar33) * lVar34;
    pfVar29 = pfVar5 + lVar15;
    pfVar22 = pfVar5 + lVar40 * lVar34;
    pfVar19 = pfVar5 + lVar41;
    pfVar16 = pfVar5 + lVar37;
    local_130 = pfVar5 + ((lVar26 + -1) - lVar28);
    local_128 = pfVar5 + ((lVar39 + -1) - lVar28);
    pfVar25 = pfVar5 + lVar26 + (int)uVar14;
    pfVar17 = pfVar5 + lVar39 + (int)uVar14;
    pfVar27 = pfVar5 + lVar15 + uVar33;
    pfVar18 = pfVar5 + lVar40 * lVar34 + uVar33;
    pfVar21 = pfVar5 + lVar41 + uVar33;
    local_d8 = pfVar5 + lVar37 + uVar33;
    local_e0 = pfVar5 + ((lVar26 + (uVar33 - 1)) - lVar28);
    local_c0 = pfVar5 + ((lVar39 + (uVar33 - 1)) - lVar28);
    do {
      auVar11 = vfmadd213ss_fma(ZEXT416((uint)pfVar5[(int)((~uVar13 + (int)lVar40) * iVar3 +
                                                          local_40)]),SUB6416(ZEXT464(0x40400000),0)
                                ,ZEXT416((uint)fVar1));
      if (0 < iVar20) {
        fVar8 = fVar42 * auVar11._0_4_;
        pfVar36 = pfVar6 + iVar24;
        pbVar31 = pbVar7 + iVar24;
        lVar28 = 0;
        uVar38 = ~uVar14;
        uVar32 = ~uVar12;
        do {
          auVar11 = vfmadd132ss_fma(ZEXT416((uint)((local_128[lVar28] - local_130[lVar28]) +
                                                  (local_e0[lVar28] - local_c0[lVar28]))),
                                    ZEXT416((uint)((pfVar25[lVar28] - pfVar17[lVar28]) +
                                                  (pfVar5[(lVar40 - uVar33) * lVar34 +
                                                          (long)(int)uVar38] -
                                                  pfVar5[(lVar40 + -1 + uVar33) * lVar34 +
                                                         (long)(int)uVar38]))),
                                    SUB6416(ZEXT464(0xc0400000),0));
          fVar9 = auVar11._0_4_ * fVar42;
          fVar10 = fVar42 * ((((pfVar5[lVar40 * lVar34 + (long)(int)uVar32] -
                               pfVar5[(lVar40 + uVar33) * lVar34 + (long)(int)uVar32]) +
                               (pfVar29[lVar28 + -1] - pfVar22[lVar28 + -1]) +
                              (pfVar21[lVar28] - local_d8[lVar28]) +
                              (pfVar16[lVar28] - pfVar19[lVar28])) -
                             ((pfVar5[((lVar40 + -1) - uVar33) * lVar34 + (long)(int)uVar32] -
                              pfVar5[(lVar40 + -1) * lVar34 + (long)(int)uVar32]) +
                             (pfVar19[lVar28 + -1] - pfVar16[lVar28 + -1]))) -
                            ((pfVar22[lVar28] - pfVar29[lVar28]) +
                            (pfVar27[lVar28] - pfVar18[lVar28])));
          auVar11 = vfmadd231ss_fma(ZEXT416((uint)(fVar10 * -0.81 * fVar10)),ZEXT416((uint)fVar9),
                                    ZEXT416((uint)fVar8));
          *pfVar36 = auVar11._0_4_;
          *pbVar31 = 0.0 <= fVar9 + fVar8;
          lVar28 = lVar28 + lVar23;
          pfVar36 = pfVar36 + 1;
          pbVar31 = pbVar31 + 1;
          iVar24 = iVar24 + 1;
          uVar32 = uVar32 + iVar4;
          uVar38 = uVar38 + iVar4;
        } while (lVar28 < iVar20);
      }
      lVar40 = lVar40 + lVar23;
      pfVar29 = pfVar29 + lVar35;
      pfVar22 = pfVar22 + lVar35;
      pfVar19 = pfVar19 + lVar35;
      pfVar16 = pfVar16 + lVar35;
      local_130 = local_130 + lVar35;
      local_128 = local_128 + lVar35;
      pfVar25 = pfVar25 + lVar35;
      pfVar17 = pfVar17 + lVar35;
      pfVar27 = pfVar27 + lVar35;
      pfVar18 = pfVar18 + lVar35;
      pfVar21 = pfVar21 + lVar35;
      local_d8 = local_d8 + lVar35;
      local_e0 = local_e0 + lVar35;
      local_c0 = local_c0 + lVar35;
    } while (lVar40 < lVar30);
  }
  return;
}

Assistant:

inline void image_32_filter_99_case(struct response_layer *layer, struct integral_image *iimage) {
    int height = layer->height;
    int width = layer->width;

    int data_width = iimage->data_width;

    int iwidth = iimage->width;
    int iheight = iimage->height;

    float *data = (float *) iimage->data;
    int step = layer->step;
    int filter_size = layer->filter_size;
    int border = (filter_size - 1) / 2;
    int lobe = filter_size / 3;
    float inv_area = 1.f/(filter_size*filter_size);

    float Dxx, Dyy, Dxy, Dyy0, Dyy1, A, B, C, D;
    float A0, A1, B0, B1, C0, C1, D0, D1;
    int r10, r11, c10, c11, r00, r01, c00, c01;
    float* response = layer->response;
    bool* laplacian = layer->laplacian;

    int ind = 0;

    int k, k0, i, j, t0, t1, t2, t3, t4, t5, t6, t7, t8, t9;
    int x = 0;
    int y = 0;

    // Case 2.2a the filter is longer and wider than the image.

    // D is right bottom corner or to the right (possibly below image)
    // A, B, C = 0
    D0 = data[(iheight-1) * data_width + (iwidth-1)];


    // We divide it again in 3 parts.
    // 1. B outside, D inside
    // 2. B outside, D outside
    // 3. B inside, D outside

    // 1. Case: B outside, D inside
    for (x = 0; x < width*step-lobe/2; x += step) {
        // negative part
        r10 = x - lobe / 2 - 1;
        r11 = r10 + lobe;  // TODO: fix this

        D1 = data[r11 * data_width + (iwidth-1)];

        // Compute Dyy
        Dyy = D0 - 3 * D1;
        Dyy *= inv_area;

        // precompute
        t0 = x - lobe;
        t1 = x + lobe - 1;
        t2 = lobe/2 + 1;
        t3 = x - 1;
        t5 = x - lobe - 1;
        t7 = x + lobe;

        for (y = 0; y < width * step; y += step) {
            // box_integral_unconditional precompute
            t4 = y - 1;
            t6 = y - lobe - 1;
            t8 = y + lobe;

            // Compute Dxx, Dxy
            Dxx = box_integral_unconditional_opt(iimage, t0, y-border-1, t1, y+border)
                - 3 * box_integral_unconditional_opt(iimage, t0, y-t2, t1, t8-t2);
            Dxy = box_integral_unconditional_opt(iimage, t5, y, t3, t8)
                    + box_integral_unconditional_opt(iimage, x, t6, t7, t4)
                    - box_integral_unconditional_opt(iimage, t5, t6, t3, t4)
                    - box_integral_unconditional_opt(iimage, x, y, t7, t8);

            // Normalize Responses with inverse area
            Dxx *= inv_area;
            Dxy *= inv_area;

            // Calculate Determinant
            response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

            // Calculate Laplacian
            laplacian[ind] = Dxx + Dyy >= 0;
            ind += 1;
        }
    }

    // 2. Case: B outside, D outside
    Dyy = - 2 * D0;
    Dyy *= inv_area;

    for (; x < lobe/2+1; x += step) {

        // precompute
        t0 = x - lobe;
        t1 = x + lobe - 1;
        t2 = lobe/2 + 1;
        t3 = x - 1;
        t5 = x - lobe - 1;
        t7 = x + lobe;

        for (y = 0; y < width*step; y += step) {
            // box_integral_unconditional precompute
            t4 = y - 1;
            t6 = y - lobe - 1;
            t8 = y + lobe;

            // Compute Dxx, Dxy
            Dxx = box_integral_unconditional_opt(iimage, t0, y-border-1, t1, y+border)
                - 3 * box_integral_unconditional_opt(iimage, t0, y-t2, t1, t8-t2);
            Dxy = box_integral_unconditional_opt(iimage, t5, y, t3, t8)
                    + box_integral_unconditional_opt(iimage, x, t6, t7, t4)
                    - box_integral_unconditional_opt(iimage, t5, t6, t3, t4)
                    - box_integral_unconditional_opt(iimage, x, y, t7, t8);

            // Normalize Responses with inverse area
            Dxx *= inv_area;
            Dxy *= inv_area;

            // Calculate Determinant
            response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

            // Calculate Laplacian
            laplacian[ind] = Dxx + Dyy >= 0;
            ind += 1;
        }
    }

    // 3. Case: B inside, D outside
    for (; x < height * step; x += step) {
        r10 = x - lobe / 2 - 1;

        B = data[r10 * data_width + (iwidth-1)];
        // D1 = D0 - B;
        // Dyy = D0 - 3 * D1;
        // Dyy *= inv_area;

        // this can be simplified to:
        // (small difference in original is this but error is <0.000001 eps)
        Dyy = 3*B - 2*D0;
        Dyy *= inv_area;

        // precompute
        t0 = x - lobe;
        t1 = x + lobe - 1;
        t2 = lobe/2 + 1;
        t3 = x - 1;
        t5 = x - lobe - 1;
        t7 = x + lobe;

        for (y = 0; y < width * step; y += step) {
            // box_integral_unconditional precompute
            t4 = y - 1;
            t6 = y - lobe - 1;
            t8 = y + lobe;

            // Compute Dxx, Dxy
            Dxx = box_integral_unconditional_opt(iimage, t0, y-border-1, t1, y+border)
                - 3 * box_integral_unconditional_opt(iimage, t0, y-t2, t1, t8-t2);
            Dxy = box_integral_unconditional_opt(iimage, t5, y, t3, t8)
                    + box_integral_unconditional_opt(iimage, x, t6, t7, t4)
                    - box_integral_unconditional_opt(iimage, t5, t6, t3, t4)
                    - box_integral_unconditional_opt(iimage, x, y, t7, t8);

            // Normalize Responses with inverse area
            Dxx *= inv_area;
            Dxy *= inv_area;

            // Calculate Determinant
            response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

            // Calculate Laplacian
            laplacian[ind] = Dxx + Dyy >= 0;
            ind += 1;
        }
    }
}